

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O0

Image<float,_gimage::PixelTraits<float>_> *
gimage::operator-=(Image<float,_gimage::PixelTraits<float>_> *image,work_t s)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  store_t_conflict sVar4;
  float v;
  long i;
  long k;
  int d;
  Image<float,_gimage::PixelTraits<float>_> *this;
  int iVar5;
  Image<float,_gimage::PixelTraits<float>_> *pIVar6;
  Image<float,_gimage::PixelTraits<float>_> *this_00;
  Image<float,_gimage::PixelTraits<float>_> *local_18;
  int local_10;
  
  local_10 = 0;
  while (iVar5 = local_10, iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RDI),
        iVar5 < iVar2) {
    local_18 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
    while (this = local_18, lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDI),
          (long)this < lVar3) {
      pIVar6 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
      while (this_00 = pIVar6, lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI),
            (long)pIVar6 < lVar3) {
        sVar4 = Image<float,_gimage::PixelTraits<float>_>::get
                          (in_RDI,(long)this_00,(long)local_18,local_10);
        bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                          (this,(store_t_conflict)((ulong)pIVar6 >> 0x20));
        if (bVar1) {
          Image<float,_gimage::PixelTraits<float>_>::setLimited
                    (this_00,CONCAT44(sVar4,iVar5),(long)this,(int)((ulong)pIVar6 >> 0x20),
                     SUB84(pIVar6,0));
        }
        pIVar6 = (Image<float,_gimage::PixelTraits<float>_> *)((long)&this_00->depth + 1);
      }
      local_18 = (Image<float,_gimage::PixelTraits<float>_> *)((long)&local_18->depth + 1);
    }
    local_10 = local_10 + 1;
  }
  return in_RDI;
}

Assistant:

Image<T> &operator-=(Image<T> &image, typename Image<T>::work_t s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, v-s);
        }
      }
    }
  }

  return image;
}